

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::JUnitReporter>(ContextOptions *o)

{
  IReporter *pIVar1;
  ContextOptions *in_stack_ffffffffffffffe8;
  JUnitReporter *in_stack_fffffffffffffff0;
  
  pIVar1 = (IReporter *)operator_new(0xd0);
  anon_unknown_14::JUnitReporter::JUnitReporter(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8)
  ;
  return pIVar1;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
            return new Reporter(o);
        }